

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void getTimeCode(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypedAttribute<Imf_3_2::TimeCode> *this;
  ulong uVar2;
  invalid_argument *this_00;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70 [2];
  SetAttr local_60;
  
  if (*i <= argc + -3) {
    this = (TypedAttribute<Imf_3_2::TimeCode> *)operator_new(0x10);
    Imf_3_2::TypedAttribute<Imf_3_2::TimeCode>::TypedAttribute(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,attrName,&local_81);
    paVar1 = &local_60.name.field_2;
    local_60.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80,local_78 + (long)local_80);
    local_60.part = part;
    local_60.attr = (Attribute *)this;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name._M_dataplus._M_p,local_60.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    uVar2 = strtoul(argv[(long)*i + 1],(char **)0x0,0x10);
    Imf_3_2::TimeCode::setTimeAndFlags(this + 8,uVar2 & 0xffffffff,0);
    strtoul(argv[(long)*i + 2],(char **)0x0,0x10);
    Imf_3_2::TimeCode::setUserData((uint)(this + 8));
    *i = *i + 3;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Expected a time code");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getTimeCode (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 3)
        throw invalid_argument("Expected a time code");

    TimeCodeAttribute* a = new TimeCodeAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().setTimeAndFlags (strtoul (argv[i + 1], 0, 16));
    a->value ().setUserData (strtoul (argv[i + 2], 0, 16));
    i += 3;
}